

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeLocalSet(TranslateToFuzzReader *this,Type type)

{
  Index index;
  mapped_type *vec;
  Expression *value;
  value_type_conflict3 *pvVar1;
  Type TVar2;
  Type local_38;
  
  local_38.id = type.id;
  if (type.id == 0) {
    local_38 = getConcreteType(this);
  }
  vec = std::__detail::
        _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)&this->funcContext->typeLocals,&local_38);
  if ((vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    TVar2.id = (uintptr_t)makeTrivial(this,type);
  }
  else {
    value = make(this,local_38);
    pvVar1 = Random::pick<std::vector<unsigned_int,std::allocator<unsigned_int>>>(&this->random,vec)
    ;
    index = *pvVar1;
    if (type.id == 0) {
      TVar2.id = (uintptr_t)Builder::makeLocalSet(&this->builder,index,value);
    }
    else {
      TVar2.id = (uintptr_t)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
      *(undefined1 *)TVar2.id = 9;
      *(undefined8 *)(TVar2.id + 8) = 0;
      *(Index *)(TVar2.id + 0x10) = index;
      *(Expression **)(TVar2.id + 0x18) = value;
      wasm::LocalSet::makeTee(TVar2);
    }
  }
  return (Expression *)(LocalSet *)TVar2.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeLocalSet(Type type) {
  bool tee = type != Type::none;
  Type valueType;
  if (tee) {
    valueType = type;
  } else {
    valueType = getConcreteType();
  }
  auto& locals = funcContext->typeLocals[valueType];
  if (locals.empty()) {
    return makeTrivial(type);
  }
  auto* value = make(valueType);
  if (tee) {
    return builder.makeLocalTee(pick(locals), value, valueType);
  } else {
    return builder.makeLocalSet(pick(locals), value);
  }
}